

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

void __thiscall
cmCTestTestHandler::ExpandTestsToRunInformationForRerunFailed(cmCTestTestHandler *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  unsigned_long uVar6;
  string local_890 [32];
  undefined1 local_870 [8];
  ostringstream cmCTestLog_msg_2;
  string local_6f8 [36];
  int local_6d4;
  long lStack_6d0;
  int val;
  size_type pos;
  string line;
  ifstream ifs;
  string local_4a0 [32];
  undefined1 local_480 [8];
  ostringstream cmCTestLog_msg_1;
  string local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  undefined1 local_2c8 [8];
  string lastTestsFailedLog;
  string local_2a0 [4];
  int res;
  string fileNameSubstring;
  undefined1 local_278 [8];
  string fileName;
  int i;
  string logName;
  string local_228 [8];
  string pattern;
  int numFiles;
  undefined1 local_1e0 [8];
  ostringstream cmCTestLog_msg;
  Directory local_68;
  Directory directory;
  string local_50;
  undefined1 local_30 [8];
  string dirName;
  cmCTestTestHandler *this_local;
  
  dirName.field_2._8_8_ = this;
  cmCTest::GetBinaryDir_abi_cxx11_(&local_50,(this->super_cmCTestGenericHandler).CTest);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 &local_50,"/Testing/Temporary");
  std::__cxx11::string::~string((string *)&local_50);
  cmsys::Directory::Directory(&local_68);
  bVar2 = cmsys::Directory::Load(&local_68,(string *)local_30);
  if (bVar2) {
    uVar6 = cmsys::Directory::GetNumberOfFilesInDirectory((string *)local_30);
    pattern.field_2._8_4_ = (undefined4)uVar6;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_228,"LastTestsFailed",(allocator *)(logName.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(logName.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&i,"",(allocator *)(fileName.field_2._M_local_buf + 0xf))
    ;
    std::allocator<char>::~allocator((allocator<char> *)(fileName.field_2._M_local_buf + 0xf));
    for (fileName.field_2._8_4_ = 0; (int)fileName.field_2._8_4_ < (int)pattern.field_2._8_4_;
        fileName.field_2._8_4_ = fileName.field_2._8_4_ + 1) {
      pcVar5 = cmsys::Directory::GetFile(&local_68,(long)(int)fileName.field_2._8_4_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_278,pcVar5,
                 (allocator *)(fileNameSubstring.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator
                ((allocator<char> *)(fileNameSubstring.field_2._M_local_buf + 0xf));
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)local_2a0,(ulong)local_278);
      iVar3 = std::__cxx11::string::compare(local_2a0);
      if (iVar3 == 0) {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&i,"");
        if (bVar2) {
          std::__cxx11::string::operator=((string *)&i,(string *)local_278);
        }
        else {
          cmsys::SystemTools::FileTimeCompare
                    ((string *)&i,(string *)local_278,
                     (int *)(lastTestsFailedLog.field_2._M_local_buf + 0xc));
          if (lastTestsFailedLog.field_2._12_4_ == -1) {
            std::__cxx11::string::operator=((string *)&i,(string *)local_278);
          }
        }
        pattern.field_2._12_4_ = 0;
      }
      else {
        pattern.field_2._12_4_ = 6;
      }
      std::__cxx11::string::~string(local_2a0);
      std::__cxx11::string::~string((string *)local_278);
    }
    cmCTest::GetBinaryDir_abi_cxx11_(&local_308,(this->super_cmCTestGenericHandler).CTest);
    std::operator+(&local_2e8,&local_308,"/Testing/Temporary/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8,
                   &local_2e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_308);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    bVar2 = cmsys::SystemTools::FileExists(pcVar5);
    if (bVar2) {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      std::ifstream::ifstream((void *)((long)&line.field_2 + 8),pcVar5,_S_in);
      bVar2 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&line.field_2 + *(long *)(line.field_2._8_8_ + -0x18) + 8));
      if (bVar2) {
        std::__cxx11::string::string((string *)&pos);
        while (bVar2 = cmsys::SystemTools::GetLineFromStream
                                 ((istream *)(line.field_2._M_local_buf + 8),(string *)&pos,
                                  (bool *)0x0,-1), bVar2) {
          lStack_6d0 = std::__cxx11::string::find((char)&pos,0x3a);
          if (lStack_6d0 != -1) {
            std::__cxx11::string::substr((ulong)local_6f8,(ulong)&pos);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            iVar3 = atoi(pcVar5);
            std::__cxx11::string::~string(local_6f8);
            local_6d4 = iVar3;
            std::vector<int,_std::allocator<int>_>::push_back(&this->TestsToRun,&local_6d4);
          }
        }
        std::ifstream::close();
        std::__cxx11::string::~string((string *)&pos);
      }
      else {
        bVar2 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
        if ((!bVar2) &&
           (bVar2 = cmCTest::ShouldPrintLabels((this->super_cmCTestGenericHandler).CTest), !bVar2))
        {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_870);
          poVar4 = std::operator<<((ostream *)local_870,"Problem reading file: ");
          poVar4 = std::operator<<(poVar4,(string *)local_2c8);
          poVar4 = std::operator<<(poVar4," while generating list of previously failed tests.");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                       ,0x71b,pcVar5,false);
          std::__cxx11::string::~string(local_890);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_870);
        }
      }
      std::ifstream::~ifstream((void *)((long)&line.field_2 + 8));
      pattern.field_2._12_4_ = 0;
    }
    else {
      bVar2 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
      if ((!bVar2) &&
         (bVar2 = cmCTest::ShouldPrintLabels((this->super_cmCTestGenericHandler).CTest), !bVar2)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_480);
        poVar4 = std::operator<<((ostream *)local_480,(string *)local_2c8);
        poVar4 = std::operator<<(poVar4," does not exist!");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                     ,0x6ff,pcVar5,false);
        std::__cxx11::string::~string(local_4a0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_480);
      }
      pattern.field_2._12_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_2c8);
    std::__cxx11::string::~string((string *)&i);
    std::__cxx11::string::~string(local_228);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
    poVar4 = std::operator<<((ostream *)local_1e0,"Unable to read the contents of ");
    poVar4 = std::operator<<(poVar4,(string *)local_30);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x6d3,pcVar5,false);
    std::__cxx11::string::~string((string *)&numFiles);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
    pattern.field_2._12_4_ = 1;
  }
  cmsys::Directory::~Directory(&local_68);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmCTestTestHandler::ExpandTestsToRunInformationForRerunFailed()
{

  std::string dirName = this->CTest->GetBinaryDir() + "/Testing/Temporary";

  cmsys::Directory directory;
  if (directory.Load(dirName) == 0)
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Unable to read the contents of "
      << dirName << std::endl);
    return;
    }

  int numFiles = static_cast<int>
    (cmsys::Directory::GetNumberOfFilesInDirectory(dirName));
  std::string pattern = "LastTestsFailed";
  std::string logName = "";

  for (int i = 0; i < numFiles; ++i)
    {
    std::string fileName = directory.GetFile(i);
    // bcc crashes if we attempt a normal substring comparison,
    // hence the following workaround
    std::string fileNameSubstring = fileName.substr(0, pattern.length());
    if (fileNameSubstring.compare(pattern) != 0)
      {
      continue;
      }
    if (logName == "")
      {
      logName = fileName;
      }
    else
      {
      // if multiple matching logs were found we use the most recently
      // modified one.
      int res;
      cmSystemTools::FileTimeCompare(logName, fileName, &res);
      if (res == -1)
        {
        logName = fileName;
        }
      }
    }

  std::string lastTestsFailedLog = this->CTest->GetBinaryDir()
    + "/Testing/Temporary/" + logName;

  if ( !cmSystemTools::FileExists(lastTestsFailedLog.c_str()) )
    {
    if ( !this->CTest->GetShowOnly() && !this->CTest->ShouldPrintLabels() )
      {
      cmCTestLog(this->CTest, ERROR_MESSAGE, lastTestsFailedLog
        << " does not exist!" << std::endl);
      }
    return;
    }

  // parse the list of tests to rerun from LastTestsFailed.log
  cmsys::ifstream ifs(lastTestsFailedLog.c_str());
  if ( ifs )
    {
    std::string line;
    std::string::size_type pos;
    while ( cmSystemTools::GetLineFromStream(ifs, line) )
      {
      pos = line.find(':', 0);
      if (pos == line.npos)
        {
        continue;
        }

      int val = atoi(line.substr(0, pos).c_str());
      this->TestsToRun.push_back(val);
      }
    ifs.close();
    }
  else if ( !this->CTest->GetShowOnly() && !this->CTest->ShouldPrintLabels() )
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Problem reading file: "
      << lastTestsFailedLog <<
      " while generating list of previously failed tests." << std::endl);
    }
}